

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

InstructionAtom * __thiscall Instruction::get_imm_src(Instruction *this)

{
  long in_RDI;
  int i;
  int local_c;
  
  local_c = 0;
  while( true ) {
    if ((int)(uint)*(byte *)(in_RDI + 4) <= local_c) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Instruction.cpp"
                    ,0xf1,"InstructionAtom &Instruction::get_imm_src()");
    }
    if (*(int *)(in_RDI + 8 + (long)local_c * 0x30) == 1) break;
    local_c = local_c + 1;
  }
  return (InstructionAtom *)(in_RDI + 8 + (long)local_c * 0x30);
}

Assistant:

InstructionAtom& Instruction::get_imm_src() {
  for (int i = 0; i < n_src; i++) {
    if (src[i].kind == InstructionAtom::IMM) {
      return src[i];
    }
  }
  assert(false);
  return src[0];
}